

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

uchar * LoadFileData(char *fileName,uint *bytesRead)

{
  uint uVar1;
  uchar *puVar2;
  FILE *__stream;
  long lVar3;
  size_t sVar4;
  uint count;
  int size;
  FILE *file;
  uchar *data;
  uint *bytesRead_local;
  char *fileName_local;
  
  file = (FILE *)0x0;
  *bytesRead = 0;
  if (fileName == (char *)0x0) {
    TraceLog(4,"FILEIO: File name provided is not valid");
  }
  else {
    if (loadFileData != (LoadFileDataCallback)0x0) {
      puVar2 = (*loadFileData)(fileName,bytesRead);
      return puVar2;
    }
    __stream = fopen(fileName,"rb");
    if (__stream == (FILE *)0x0) {
      TraceLog(4,"FILEIO: [%s] Failed to open file",fileName);
    }
    else {
      fseek(__stream,0,2);
      lVar3 = ftell(__stream);
      uVar1 = (uint)lVar3;
      fseek(__stream,0,0);
      if ((int)uVar1 < 1) {
        TraceLog(4,"FILEIO: [%s] Failed to read file",fileName);
      }
      else {
        file = (FILE *)malloc((long)(int)uVar1);
        sVar4 = fread(file,1,(long)(int)uVar1,__stream);
        *bytesRead = (uint)sVar4;
        if ((uint)sVar4 == uVar1) {
          TraceLog(3,"FILEIO: [%s] File loaded successfully",fileName);
        }
        else {
          TraceLog(4,"FILEIO: [%s] File partially loaded",fileName);
        }
      }
      fclose(__stream);
    }
  }
  return (uchar *)file;
}

Assistant:

unsigned char *LoadFileData(const char *fileName, unsigned int *bytesRead)
{
    unsigned char *data = NULL;
    *bytesRead = 0;

    if (fileName != NULL)
    {
        if (loadFileData)
        {
            data = loadFileData(fileName, bytesRead);
            return data;
        }
#if defined(SUPPORT_STANDARD_FILEIO)
        FILE *file = fopen(fileName, "rb");

        if (file != NULL)
        {
            // WARNING: On binary streams SEEK_END could not be found,
            // using fseek() and ftell() could not work in some (rare) cases
            fseek(file, 0, SEEK_END);
            int size = ftell(file);
            fseek(file, 0, SEEK_SET);

            if (size > 0)
            {
                data = (unsigned char *)RL_MALLOC(size*sizeof(unsigned char));

                // NOTE: fread() returns number of read elements instead of bytes, so we read [1 byte, size elements]
                unsigned int count = (unsigned int)fread(data, sizeof(unsigned char), size, file);
                *bytesRead = count;

                if (count != size) TRACELOG(LOG_WARNING, "FILEIO: [%s] File partially loaded", fileName);
                else TRACELOG(LOG_INFO, "FILEIO: [%s] File loaded successfully", fileName);
            }
            else TRACELOG(LOG_WARNING, "FILEIO: [%s] Failed to read file", fileName);

            fclose(file);
        }
        else TRACELOG(LOG_WARNING, "FILEIO: [%s] Failed to open file", fileName);
#else
    TRACELOG(LOG_WARNING, "FILEIO: Standard file io not supported, use custom file callback");
#endif
    }
    else TRACELOG(LOG_WARNING, "FILEIO: File name provided is not valid");

    return data;
}